

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmTest * __thiscall cmMakefile::CreateTest(cmMakefile *this,string *testName)

{
  pointer this_00;
  mapped_type *this_01;
  unique_ptr<cmTest,_std::default_delete<cmTest>_> local_30;
  __single_object newTest;
  cmTest *test;
  string *testName_local;
  cmMakefile *this_local;
  
  newTest._M_t.super___uniq_ptr_impl<cmTest,_std::default_delete<cmTest>_>._M_t.
  super__Tuple_impl<0UL,_cmTest_*,_std::default_delete<cmTest>_>.
  super__Head_base<0UL,_cmTest_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmTest,_std::default_delete<cmTest>,_true,_true>)GetTest(this,testName);
  this_local = (cmMakefile *)
               newTest._M_t.super___uniq_ptr_impl<cmTest,_std::default_delete<cmTest>_>._M_t.
               super__Tuple_impl<0UL,_cmTest_*,_std::default_delete<cmTest>_>.
               super__Head_base<0UL,_cmTest_*,_false>._M_head_impl;
  if ((tuple<cmTest_*,_std::default_delete<cmTest>_>)
      newTest._M_t.super___uniq_ptr_impl<cmTest,_std::default_delete<cmTest>_>._M_t.
      super__Tuple_impl<0UL,_cmTest_*,_std::default_delete<cmTest>_>.
      super__Head_base<0UL,_cmTest_*,_false>._M_head_impl == (_Head_base<0UL,_cmTest_*,_false>)0x0)
  {
    std::make_unique<cmTest,cmMakefile*>((cmMakefile **)&local_30);
    newTest._M_t.super___uniq_ptr_impl<cmTest,_std::default_delete<cmTest>_>._M_t.
    super__Tuple_impl<0UL,_cmTest_*,_std::default_delete<cmTest>_>.
    super__Head_base<0UL,_cmTest_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmTest,_std::default_delete<cmTest>,_true,_true>)
         std::unique_ptr<cmTest,_std::default_delete<cmTest>_>::get(&local_30);
    this_00 = std::unique_ptr<cmTest,_std::default_delete<cmTest>_>::operator->(&local_30);
    cmTest::SetName(this_00,testName);
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmTest,_std::default_delete<cmTest>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmTest,_std::default_delete<cmTest>_>_>_>_>
              ::operator[](&this->Tests,testName);
    std::unique_ptr<cmTest,_std::default_delete<cmTest>_>::operator=(this_01,&local_30);
    this_local = (cmMakefile *)
                 newTest._M_t.super___uniq_ptr_impl<cmTest,_std::default_delete<cmTest>_>._M_t.
                 super__Tuple_impl<0UL,_cmTest_*,_std::default_delete<cmTest>_>.
                 super__Head_base<0UL,_cmTest_*,_false>._M_head_impl;
    std::unique_ptr<cmTest,_std::default_delete<cmTest>_>::~unique_ptr(&local_30);
  }
  return (cmTest *)this_local;
}

Assistant:

cmTest* cmMakefile::CreateTest(const std::string& testName)
{
  cmTest* test = this->GetTest(testName);
  if (test) {
    return test;
  }
  auto newTest = cm::make_unique<cmTest>(this);
  test = newTest.get();
  newTest->SetName(testName);
  this->Tests[testName] = std::move(newTest);
  return test;
}